

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall
QTableModel::removeColumns(QTableModel *this,int column,int count,QModelIndex *param_3)

{
  QList<QTableWidgetItem_*> *pQVar1;
  QTableWidgetItem *pQVar2;
  Data *pDVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int h;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column && 0 < count) {
    if ((ulong)(uint)(column + count) <= (ulong)(this->horizontalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginRemoveColumns((QModelIndex *)this,(int)&local_50,column);
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      uVar5 = (**(code **)(*(long *)this + 0x78))(this);
      uVar6 = (ulong)(uint)column;
      if (0 < (int)uVar5) {
        pQVar1 = &this->tableItems;
        uVar10 = (ulong)uVar5;
        do {
          uVar7 = uVar10 - 1;
          lVar9 = (this->horizontalHeaderItems).d.size;
          lVar8 = lVar9 * uVar7 + uVar6;
          lVar9 = (long)((int)lVar9 * (int)uVar7 + column);
          do {
            pQVar2 = (this->tableItems).d.ptr[lVar9];
            if (pQVar2 != (QTableWidgetItem *)0x0) {
              pQVar2->view = (QTableWidget *)0x0;
              (*pQVar2->_vptr_QTableWidgetItem[1])();
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < (int)lVar8 + count);
          pDVar3 = (pQVar1->d).d;
          if ((pDVar3 == (Data *)0x0) ||
             (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                      (&pQVar1->d,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
          }
          QtPrivate::QPodArrayOps<QTableWidgetItem_*>::erase
                    ((QPodArrayOps<QTableWidgetItem_*> *)pQVar1,
                     (QTableWidgetItem **)
                     (((lVar8 << 0x20) >> 0x1d) + (long)(this->tableItems).d.ptr),(ulong)(uint)count
                    );
          bVar4 = 1 < (long)uVar10;
          uVar10 = uVar7;
        } while (bVar4);
      }
      pQVar1 = &this->horizontalHeaderItems;
      uVar10 = uVar6;
      do {
        pQVar2 = (this->horizontalHeaderItems).d.ptr[uVar10];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          pQVar2->view = (QTableWidget *)0x0;
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < column + count);
      pDVar3 = (pQVar1->d).d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                  (&pQVar1->d,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
      }
      QtPrivate::QPodArrayOps<QTableWidgetItem_*>::erase
                ((QPodArrayOps<QTableWidgetItem_*> *)pQVar1,
                 (this->horizontalHeaderItems).d.ptr + uVar6,(ulong)(uint)count);
      QAbstractItemModel::endRemoveColumns();
      bVar4 = true;
      goto LAB_0059109a;
    }
  }
  bVar4 = false;
LAB_0059109a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::removeColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column + count >  horizontalHeaderItems.size())
        return false;

    beginRemoveColumns(QModelIndex(), column, column + count - 1);
    QTableWidgetItem *oldItem = nullptr;
    for (int row = rowCount() - 1; row >= 0; --row) {
        int i = tableIndex(row, column);
        for (int j = i; j < i + count; ++j) {
            oldItem = tableItems.at(j);
            if (oldItem)
                oldItem->view = nullptr;
            delete oldItem;
        }
        tableItems.remove(i, count);
    }
    for (int h=column; h<column+count; ++h) {
        oldItem = horizontalHeaderItems.at(h);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    horizontalHeaderItems.remove(column, count);
    endRemoveColumns();
    return true;
}